

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rune nk_utf_decode_byte(char c,int *i)

{
  byte bVar1;
  long lVar2;
  
  if (i == (int *)0x0) {
    __assert_fail("i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x1e72,"nk_rune nk_utf_decode_byte(char, int *)");
  }
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 5) {
      *i = 5;
      return 0;
    }
    bVar1 = nk_utfmask[lVar2];
    if ((bVar1 & c) == nk_utfbyte[lVar2]) break;
    lVar2 = lVar2 + 1;
  }
  *i = (int)lVar2;
  return (nk_rune)(byte)(~bVar1 & c);
}

Assistant:

NK_INTERN nk_rune
nk_utf_decode_byte(char c, int *i)
{
    NK_ASSERT(i);
    if (!i) return 0;
    for(*i = 0; *i < (int)NK_LEN(nk_utfmask); ++(*i)) {
        if (((nk_byte)c & nk_utfmask[*i]) == nk_utfbyte[*i])
            return (nk_byte)(c & ~nk_utfmask[*i]);
    }
    return 0;
}